

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_mtree.c
# Opt level: O0

int mtree_bid(archive_read *a,int best_bid)

{
  int iVar1;
  size_t sVar2;
  void *__s1;
  char *p;
  char *signature;
  int best_bid_local;
  archive_read *a_local;
  
  sVar2 = strlen("#mtree");
  __s1 = __archive_read_ahead(a,sVar2,(ssize_t *)0x0);
  if (__s1 == (void *)0x0) {
    a_local._4_4_ = -1;
  }
  else {
    sVar2 = strlen("#mtree");
    iVar1 = memcmp(__s1,"#mtree",sVar2);
    if (iVar1 == 0) {
      sVar2 = strlen("#mtree");
      a_local._4_4_ = (int)sVar2 << 3;
    }
    else {
      a_local._4_4_ = detect_form(a,(int *)0x0);
    }
  }
  return a_local._4_4_;
}

Assistant:

static int
mtree_bid(struct archive_read *a, int best_bid)
{
	const char *signature = "#mtree";
	const char *p;

	(void)best_bid; /* UNUSED */

	/* Now let's look at the actual header and see if it matches. */
	p = __archive_read_ahead(a, strlen(signature), NULL);
	if (p == NULL)
		return (-1);

	if (memcmp(p, signature, strlen(signature)) == 0)
		return (8 * (int)strlen(signature));

	/*
	 * There is not a mtree signature. Let's try to detect mtree format.
	 */
	return (detect_form(a, NULL));
}